

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::operator==
          (Minefield_Response_NACK_PDU *this,Minefield_Response_NACK_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Minefield_Header::operator!=(&this->super_Minefield_Header,&Value->super_Minefield_Header)
  ;
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID), !KVar1)) &&
      (this->m_ui8ReqID == Value->m_ui8ReqID)) && (this->m_ui8NumMisPdus == Value->m_ui8NumMisPdus))
  {
    bVar2 = std::operator!=(&this->m_vSeqNums,&Value->m_vSeqNums);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Minefield_Response_NACK_PDU::operator == ( const Minefield_Response_NACK_PDU & Value ) const
{
    if( Minefield_Header::operator != ( Value ) )             return false;
    if( m_ReqID                    != Value.m_ReqID )         return false;
    if( m_ui8ReqID                 != Value.m_ui8ReqID )      return false;
    if( m_ui8NumMisPdus            != Value.m_ui8NumMisPdus ) return false;
    if( m_vSeqNums                 != Value.m_vSeqNums )      return false;
    return true;
}